

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int stringmap_insert(StringMap *smap,char *key,char *value)

{
  MOJOSHADER_malloc p_Var1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  char *__dest_00;
  
  if (key == (char *)0x0) {
    __assert_fail("key != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                  ,0x124,"int stringmap_insert(StringMap *, const char *, const char *)");
  }
  if (smap->nuke != stringmap_nuke_noop) {
    p_Var1 = smap->m;
    sVar3 = strlen(key);
    __dest = (char *)(*p_Var1)((int)sVar3 + 1,smap->d);
    if (value == (char *)0x0) {
      __dest_00 = (char *)0x0;
    }
    else {
      p_Var1 = smap->m;
      sVar3 = strlen(value);
      __dest_00 = (char *)(*p_Var1)((int)sVar3 + 1,smap->d);
    }
    iVar2 = -1;
    if ((__dest != (char *)0x0) && (value == (char *)0x0 || __dest_00 != (char *)0x0)) {
      strcpy(__dest,key);
      if (value != (char *)0x0) {
        strcpy(__dest_00,value);
      }
      iVar2 = hash_insert(smap,__dest,__dest_00);
      if (0 < iVar2) {
        return 1;
      }
    }
    (*smap->f)(__dest,smap->d);
    (*smap->f)(__dest_00,smap->d);
    return iVar2;
  }
  iVar2 = hash_insert(smap,key,value);
  return iVar2;
}

Assistant:

int stringmap_insert(StringMap *smap, const char *key, const char *value)
{
    assert(key != NULL);
    if (smap->nuke == stringmap_nuke_noop)  // no copy?
        return hash_insert(smap, key, value);

    int rc = -1;
    char *k = (char *) smap->m(strlen(key) + 1, smap->d);
    char *v = (char *) (value ? smap->m(strlen(value) + 1, smap->d) : NULL);
    int failed = ( (!k) || ((!v) && (value)) );

    if (!failed)
    {
        strcpy(k, key);
        if (value != NULL)
            strcpy(v, value);
        failed = ((rc = hash_insert(smap, k, v)) <= 0);
    } // if

    if (failed)
    {
        smap->f(k, smap->d);
        smap->f(v, smap->d);
    } // if

    return rc;
}